

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

void __thiscall
wabt::interp::FreeList<wabt::interp::Object_*>::~FreeList(FreeList<wabt::interp::Object_*> *this)

{
  pointer ppOVar1;
  Object *pOVar2;
  pointer ppOVar3;
  vector<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_> *__range2;
  
  ppOVar3 = (this->list_).
            super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppOVar1 = (this->list_).
            super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppOVar3 != ppOVar1) {
    do {
      pOVar2 = *ppOVar3;
      if (pOVar2 != (Object *)0x0 && ((ulong)pOVar2 & 1) == 0) {
        (*pOVar2->_vptr_Object[1])();
      }
      ppOVar3 = ppOVar3 + 1;
    } while (ppOVar3 != ppOVar1);
    ppOVar3 = (this->list_).
              super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  if (ppOVar3 != (pointer)0x0) {
    operator_delete(ppOVar3,(long)(this->list_).
                                  super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppOVar3
                   );
    return;
  }
  return;
}

Assistant:

FreeList<T>::~FreeList() {
  for (auto object : list_) {
    if ((reinterpret_cast<uintptr_t>(object) & ptrFreeBit) == 0) {
      delete object;
    }
  }
}